

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  bool bVar1;
  __pid_t _Var2;
  int *piVar3;
  long in_FS_OFFSET;
  int gtest_retval;
  ForkingDeathTest *this_local;
  allocator<char> local_115;
  int local_114;
  undefined1 local_110 [4];
  int status_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = DeathTestImpl::spawned(&this->super_DeathTestImpl);
  if (bVar1) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      do {
        _Var2 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,&local_114,0);
        bVar1 = false;
        if (_Var2 == -1) {
          piVar3 = __errno_location();
          bVar1 = *piVar3 == 4;
        }
      } while (bVar1);
      if (_Var2 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"CHECK failed: File ",&local_115);
        std::operator+(&local_d0,&local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_b0,&local_d0,", line ");
        this_local._4_4_ = 0x407;
        StreamableToString<int>((string *)local_110,(int *)((long)&this_local + 4));
        std::operator+(&local_90,&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
        std::operator+(&local_70,&local_90,": ");
        std::operator+(&local_50,&local_70,"waitpid(child_pid_, &status_value, 0)");
        std::operator+(&local_30,&local_50," != -1");
        DeathTestAbort(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_115);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_status(&this->super_DeathTestImpl,local_114);
    this_local._0_4_ = local_114;
  }
  else {
    this_local._0_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (int)this_local;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}